

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::detail::insert_at<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *container,int pos
               ,value_type *v)

{
  difference_type dVar1;
  range_error *this;
  __const_iterator local_58;
  char *local_40;
  char *local_38;
  char *local_30;
  iterator end;
  iterator itr;
  value_type *v_local;
  int pos_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *container_local;
  
  end = Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin(container);
  local_30 = (char *)Catch::clara::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                               (container);
  if (-1 < pos) {
    local_38 = end._M_current;
    local_40 = local_30;
    dVar1 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )end._M_current,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_30);
    if (pos <= dVar1) {
      std::advance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int>(&end,pos);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&end);
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::insert(container,local_58,*v);
      return;
    }
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Cannot insert past end of range");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void insert_at(Type &container, int pos, const typename Type::value_type &v) {
      auto itr = container.begin();
      auto end = container.end();

      if (pos < 0 || std::distance(itr, end) < pos) {
        throw std::range_error("Cannot insert past end of range");
      }

      std::advance(itr, pos);
      container.insert(itr, v);
    }